

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O2

bool woff2::GetGlyphData(Font *font,int glyph_index,uint8_t **glyph_data,size_t *glyph_size)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  Table *pTVar5;
  Table *pTVar6;
  Table *pTVar7;
  ushort uVar8;
  size_t sVar9;
  uint uVar10;
  Buffer loca_buf;
  Buffer local_50;
  size_t *local_38;
  
  if (glyph_index < 0) {
    return false;
  }
  local_38 = glyph_size;
  pTVar5 = Font::FindTable(font,0x68656164);
  pTVar6 = Font::FindTable(font,0x6c6f6361);
  pTVar7 = Font::FindTable(font,0x676c7966);
  if ((pTVar7 != (Table *)0x0 && (pTVar6 != (Table *)0x0 && pTVar5 != (Table *)0x0)) &&
     (0x33 < pTVar5->length)) {
    iVar3 = IndexFormat(font);
    local_50.buffer_ = pTVar6->data;
    local_50.length_ = (size_t)pTVar6->length;
    local_50.offset_ = 0;
    if (iVar3 == 0) {
      bVar1 = Buffer::Skip(&local_50,(ulong)(uint)(glyph_index * 2));
      if (((bVar1) && (local_50.offset_ + 2 <= local_50.length_)) &&
         (local_50.offset_ + 4 <= local_50.length_)) {
        uVar2 = *(ushort *)(local_50.buffer_ + local_50.offset_) << 8 |
                *(ushort *)(local_50.buffer_ + local_50.offset_) >> 8;
        uVar8 = *(ushort *)(local_50.buffer_ + local_50.offset_ + 2) << 8 |
                *(ushort *)(local_50.buffer_ + local_50.offset_ + 2) >> 8;
        if ((uVar2 <= uVar8) && ((uint)uVar8 + (uint)uVar8 <= pTVar7->length)) {
          *glyph_data = pTVar7->data + ((uint)uVar2 + (uint)uVar2);
          sVar9 = (size_t)(int)(((uint)uVar8 - (uint)uVar2) * 2);
          goto LAB_0010abde;
        }
      }
    }
    else {
      bVar1 = Buffer::Skip(&local_50,(ulong)(uint)(glyph_index << 2));
      if (((bVar1) && (local_50.offset_ + 4 <= local_50.length_)) &&
         (uVar10 = *(uint *)(local_50.buffer_ + local_50.offset_),
         local_50.offset_ + 8 <= local_50.length_)) {
        uVar4 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
        uVar10 = *(uint *)(local_50.buffer_ + local_50.offset_ + 4);
        uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18
        ;
        sVar9 = (size_t)(uVar10 - uVar4);
        if ((uVar4 <= uVar10) && (uVar10 <= pTVar7->length)) {
          *glyph_data = pTVar7->data + uVar4;
LAB_0010abde:
          *local_38 = sVar9;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool GetGlyphData(const Font& font, int glyph_index,
                  const uint8_t** glyph_data, size_t* glyph_size) {
  if (glyph_index < 0) {
    return FONT_COMPRESSION_FAILURE();
  }
  const Font::Table* head_table = font.FindTable(kHeadTableTag);
  const Font::Table* loca_table = font.FindTable(kLocaTableTag);
  const Font::Table* glyf_table = font.FindTable(kGlyfTableTag);
  if (head_table == NULL || loca_table == NULL || glyf_table == NULL ||
      head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  int index_fmt = IndexFormat(font);

  Buffer loca_buf(loca_table->data, loca_table->length);
  if (index_fmt == 0) {
    uint16_t offset1, offset2;
    if (!loca_buf.Skip(2 * glyph_index) ||
        !loca_buf.ReadU16(&offset1) ||
        !loca_buf.ReadU16(&offset2) ||
        offset2 < offset1 ||
        2 * offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + 2 * offset1;
    *glyph_size = 2 * (offset2 - offset1);
  } else {
    uint32_t offset1, offset2;
    if (!loca_buf.Skip(4 * glyph_index) ||
        !loca_buf.ReadU32(&offset1) ||
        !loca_buf.ReadU32(&offset2) ||
        offset2 < offset1 ||
        offset2 > glyf_table->length) {
      return FONT_COMPRESSION_FAILURE();
    }
    *glyph_data = glyf_table->data + offset1;
    *glyph_size = offset2 - offset1;
  }
  return true;
}